

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O0

int SubsetCountNodesAux(DdNode *node,st__table *table,double max)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *val;
  int *pminBar;
  int *pmin;
  NodeData_t *dummyNBar;
  NodeData_t *dummyNnv;
  NodeData_t *dummyNv;
  NodeData_t *dummyN;
  double minNnv;
  double minNv;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  int local_30;
  int i;
  int eval;
  int tval;
  double max_local;
  st__table *table_local;
  DdNode *node_local;
  
  if ((node == (DdNode *)0x0) || (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff)) {
    node_local._4_4_ = 0;
  }
  else {
    _eval = (NodeData_t *)max;
    max_local = (double)table;
    table_local = (st__table *)node;
    iVar1 = st__lookup(table,(char *)node,(char **)&dummyNv);
    if (iVar1 == 1) {
      if (dummyNv->nodesPointer == (int *)0x0) {
        Nv = (DdNode *)((ulong)table_local & 0xfffffffffffffffe);
        Nnv = (DdNode *)((ulong)(Nv->type).kids.T ^ (long)(int)((uint)table_local & 1));
        minNv = (double)((ulong)(Nv->type).kids.E ^ (long)(int)((uint)table_local & 1));
        if (*(int *)((ulong)Nnv & 0xfffffffffffffffe) == 0x7fffffff) {
          if (Nnv == zero) {
            minNnv = 0.0;
          }
          else {
            minNnv = (double)_eval;
          }
        }
        else {
          iVar1 = st__lookup((st__table *)max_local,(char *)Nnv,(char **)&dummyNnv);
          if (iVar1 != 1) {
            return 0;
          }
          minNnv = *dummyNnv->mintermPointer;
        }
        if (*(int *)((ulong)minNv & 0xfffffffffffffffe) == 0x7fffffff) {
          if ((DdNode *)minNv == zero) {
            dummyN = (NodeData_t *)0x0;
          }
          else {
            dummyN = _eval;
          }
        }
        else {
          iVar1 = st__lookup((st__table *)max_local,(char *)minNv,(char **)&dummyNBar);
          if (iVar1 != 1) {
            return 0;
          }
          dummyN = (NodeData_t *)*dummyNBar->mintermPointer;
        }
        if (minNnv < (double)dummyN) {
          local_30 = SubsetCountNodesAux((DdNode *)minNv,(st__table *)max_local,(double)_eval);
          if (memOut != 0) {
            return 0;
          }
          i = SubsetCountNodesAux(Nnv,(st__table *)max_local,(double)_eval);
          if (memOut != 0) {
            return 0;
          }
          if (pageIndex == pageSize) {
            ResizeCountNodePages();
          }
          if (memOut != 0) {
            for (N._4_4_ = 0; N._4_4_ <= page; N._4_4_ = N._4_4_ + 1) {
              if (mintermPages[N._4_4_] != (double *)0x0) {
                free(mintermPages[N._4_4_]);
                mintermPages[N._4_4_] = (double *)0x0;
              }
            }
            if (mintermPages != (double **)0x0) {
              free(mintermPages);
              mintermPages = (double **)0x0;
            }
            for (N._4_4_ = 0; N._4_4_ <= nodeDataPage; N._4_4_ = N._4_4_ + 1) {
              if (nodeDataPages[N._4_4_] != (NodeData_t *)0x0) {
                free(nodeDataPages[N._4_4_]);
                nodeDataPages[N._4_4_] = (NodeData_t *)0x0;
              }
            }
            if (nodeDataPages != (NodeData_t **)0x0) {
              free(nodeDataPages);
              nodeDataPages = (NodeData_t **)0x0;
            }
            st__free_table((st__table *)max_local);
            return 0;
          }
          piVar2 = currentLightNodePage + pageIndex;
          *piVar2 = i;
          dummyNv->lightChildNodesPointer = piVar2;
        }
        else {
          i = SubsetCountNodesAux(Nnv,(st__table *)max_local,(double)_eval);
          if (memOut != 0) {
            return 0;
          }
          local_30 = SubsetCountNodesAux((DdNode *)minNv,(st__table *)max_local,(double)_eval);
          if (memOut != 0) {
            return 0;
          }
          if (pageIndex == pageSize) {
            ResizeCountNodePages();
          }
          if (memOut != 0) {
            for (N._4_4_ = 0; N._4_4_ <= page; N._4_4_ = N._4_4_ + 1) {
              if (mintermPages[N._4_4_] != (double *)0x0) {
                free(mintermPages[N._4_4_]);
                mintermPages[N._4_4_] = (double *)0x0;
              }
            }
            if (mintermPages != (double **)0x0) {
              free(mintermPages);
              mintermPages = (double **)0x0;
            }
            for (N._4_4_ = 0; N._4_4_ <= nodeDataPage; N._4_4_ = N._4_4_ + 1) {
              if (nodeDataPages[N._4_4_] != (NodeData_t *)0x0) {
                free(nodeDataPages[N._4_4_]);
                nodeDataPages[N._4_4_] = (NodeData_t *)0x0;
              }
            }
            if (nodeDataPages != (NodeData_t **)0x0) {
              free(nodeDataPages);
              nodeDataPages = (NodeData_t **)0x0;
            }
            st__free_table((st__table *)max_local);
            return 0;
          }
          piVar2 = currentLightNodePage + pageIndex;
          *piVar2 = local_30;
          dummyNv->lightChildNodesPointer = piVar2;
        }
        piVar2 = currentNodePage + pageIndex;
        *piVar2 = i + local_30 + 1;
        dummyNv->nodesPointer = piVar2;
        pageIndex = pageIndex + 1;
        iVar1 = st__lookup((st__table *)max_local,(char *)((ulong)table_local ^ 1),(char **)&pmin);
        if (iVar1 == 1) {
          if (pageIndex == pageSize) {
            ResizeCountNodePages();
          }
          if (memOut != 0) {
            for (N._4_4_ = 0; N._4_4_ < page; N._4_4_ = N._4_4_ + 1) {
              if (mintermPages[N._4_4_] != (double *)0x0) {
                free(mintermPages[N._4_4_]);
                mintermPages[N._4_4_] = (double *)0x0;
              }
            }
            if (mintermPages != (double **)0x0) {
              free(mintermPages);
              mintermPages = (double **)0x0;
            }
            for (N._4_4_ = 0; N._4_4_ < nodeDataPage; N._4_4_ = N._4_4_ + 1) {
              if (nodeDataPages[N._4_4_] != (NodeData_t *)0x0) {
                free(nodeDataPages[N._4_4_]);
                nodeDataPages[N._4_4_] = (NodeData_t *)0x0;
              }
            }
            if (nodeDataPages != (NodeData_t **)0x0) {
              free(nodeDataPages);
              nodeDataPages = (NodeData_t **)0x0;
            }
            st__free_table((st__table *)max_local);
            return 0;
          }
          piVar3 = currentLightNodePage + pageIndex;
          *piVar3 = 0;
          *(int **)(pmin + 4) = piVar3;
          if (pageIndex == pageSize) {
            ResizeCountNodePages();
          }
          if (memOut != 0) {
            for (N._4_4_ = 0; N._4_4_ < page; N._4_4_ = N._4_4_ + 1) {
              if (mintermPages[N._4_4_] != (double *)0x0) {
                free(mintermPages[N._4_4_]);
                mintermPages[N._4_4_] = (double *)0x0;
              }
            }
            if (mintermPages != (double **)0x0) {
              free(mintermPages);
              mintermPages = (double **)0x0;
            }
            for (N._4_4_ = 0; N._4_4_ < nodeDataPage; N._4_4_ = N._4_4_ + 1) {
              if (nodeDataPages[N._4_4_] != (NodeData_t *)0x0) {
                free(nodeDataPages[N._4_4_]);
                nodeDataPages[N._4_4_] = (NodeData_t *)0x0;
              }
            }
            if (nodeDataPages != (NodeData_t **)0x0) {
              free(nodeDataPages);
              nodeDataPages = (NodeData_t **)0x0;
            }
            st__free_table((st__table *)max_local);
            return 0;
          }
          piVar3 = currentNodePage + pageIndex;
          *piVar3 = 0;
          *(int **)(pmin + 2) = piVar3;
          pageIndex = pageIndex + 1;
        }
        node_local._4_4_ = *piVar2;
      }
      else {
        node_local._4_4_ = 0;
      }
    }
    else {
      node_local._4_4_ = 0;
    }
  }
  return node_local._4_4_;
}

Assistant:

static int
SubsetCountNodesAux(
  DdNode * node /* current node */,
  st__table * table /* table to update node count, also serves as visited table. */,
  double  max /* maximum number of variables */)
{
    int tval, eval, i;
    DdNode *N, *Nv, *Nnv;
    double minNv, minNnv;
    NodeData_t *dummyN, *dummyNv, *dummyNnv, *dummyNBar;
    int *pmin, *pminBar, *val;

    if ((node == NULL) || Cudd_IsConstant(node))
        return(0);

    /* if this node has been processed do nothing */
    if ( st__lookup(table, (const char *)node, (char **)&dummyN) == 1) {
        val = dummyN->nodesPointer;
        if (val != NULL)
            return(0);
    } else {
        return(0);
    }

    N  = Cudd_Regular(node);
    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* find the minterm counts for the THEN and ELSE branches */
    if (Cudd_IsConstant(Nv)) {
        if (Nv == zero) {
            minNv = 0.0;
        } else {
            minNv = max;
        }
    } else {
        if ( st__lookup(table, (const char *)Nv, (char **)&dummyNv) == 1)
            minNv = *(dummyNv->mintermPointer);
        else {
            return(0);
        }
    }
    if (Cudd_IsConstant(Nnv)) {
        if (Nnv == zero) {
            minNnv = 0.0;
        } else {
            minNnv = max;
        }
    } else {
        if ( st__lookup(table, (const char *)Nnv, (char **)&dummyNnv) == 1) {
            minNnv = *(dummyNnv->mintermPointer);
        }
        else {
            return(0);
        }
    }


    /* recur based on which has larger minterm, */
    if (minNv >= minNnv) {
        tval = SubsetCountNodesAux(Nv, table, max);
        if (memOut) return(0);
        eval = SubsetCountNodesAux(Nnv, table, max);
        if (memOut) return(0);

        /* store the node count of the lighter child. */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pmin = currentLightNodePage + pageIndex;
        *pmin = eval; /* Here the ELSE child is lighter */
        dummyN->lightChildNodesPointer = pmin;

    } else {
        eval = SubsetCountNodesAux(Nnv, table, max);
        if (memOut) return(0);
        tval = SubsetCountNodesAux(Nv, table, max);
        if (memOut) return(0);

        /* store the node count of the lighter child. */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pmin = currentLightNodePage + pageIndex;
        *pmin = tval; /* Here the THEN child is lighter */
        dummyN->lightChildNodesPointer = pmin;

    }
    /* updating the page index for node count storage. */
    pmin = currentNodePage + pageIndex;
    *pmin = tval + eval + 1;
    dummyN->nodesPointer = pmin;

    /* pageIndex is parallel page index for count_nodes and count_lightNodes */
    pageIndex++;

    /* if this node has been reached first, it belongs to a heavier
       branch. Its complement will be reached later on a lighter branch.
       Hence the complement has zero node count. */

    if ( st__lookup(table, (const char *)Cudd_Not(node), (char **)&dummyNBar) == 1)  {
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i < nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pminBar = currentLightNodePage + pageIndex;
        *pminBar = 0;
        dummyNBar->lightChildNodesPointer = pminBar;
        /* The lighter child has less nodes than the parent.
         * So if parent 0 then lighter child zero
         */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i < nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pminBar = currentNodePage + pageIndex;
        *pminBar = 0;
        dummyNBar->nodesPointer = pminBar ; /* maybe should point to zero */

        pageIndex++;
    }
    return(*pmin);
}